

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

ssize_t __thiscall higan::FileForRead::ReadFileToBuffer(FileForRead *this,Buffer *buffer)

{
  FileForRead *local_28;
  size_t result;
  Buffer *buffer_local;
  FileForRead *this_local;
  
  if (buffer == (Buffer *)0x0) {
    this_local = (FileForRead *)0xffffffffffffffff;
  }
  else {
    if (this->file_status_ == OPEN_SUCCESS) {
      local_28 = (FileForRead *)Buffer::ReadFromFd(buffer,this->read_fd_);
    }
    else {
      local_28 = (FileForRead *)0xffffffffffffffff;
    }
    this_local = local_28;
  }
  return (ssize_t)this_local;
}

Assistant:

ssize_t FileForRead::ReadFileToBuffer(Buffer* buffer)
{
	if (!buffer)
	{
		return -1;
	}

	size_t result = -1;
	if (file_status_ == FileStatus::OPEN_SUCCESS)
	{
		result = buffer->ReadFromFd(read_fd_);
	}
	else
	{
		result = -1;
	}

	return result;
}